

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QWellArray::setSelected(QWellArray *this,int row,int col)

{
  bool bVar1;
  QMenu *pQVar2;
  QWidget *this_00;
  int in_EDX;
  int in_ESI;
  int __fd;
  long in_RDI;
  int oldCol;
  int oldRow;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 local_10;
  undefined4 local_c;
  
  uVar4 = *(undefined4 *)(in_RDI + 0x40);
  uVar3 = *(undefined4 *)(in_RDI + 0x44);
  if ((in_ESI < 0) || (local_10 = in_EDX, local_c = in_ESI, in_EDX < 0)) {
    local_10 = -1;
    local_c = -1;
  }
  *(int *)(in_RDI + 0x44) = local_10;
  *(int *)(in_RDI + 0x40) = local_c;
  updateCell((QWellArray *)CONCAT44(uVar4,uVar3),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  __fd = *(int *)(in_RDI + 0x40);
  updateCell((QWellArray *)CONCAT44(uVar4,uVar3),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (-1 < local_c) {
    __fd = local_c;
    selected((QWellArray *)0x731684,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  bVar1 = QWidget::isVisible((QWidget *)0x73168e);
  if (bVar1) {
    QWidget::parentWidget((QWidget *)0x73169e);
    pQVar2 = qobject_cast<QMenu*>((QObject *)0x7316a6);
    if (pQVar2 != (QMenu *)0x0) {
      this_00 = QWidget::parentWidget((QWidget *)0x7316b6);
      QWidget::close(this_00,__fd);
    }
  }
  return;
}

Assistant:

void QWellArray::setSelected(int row, int col)
{
    int oldRow = selRow;
    int oldCol = selCol;

    if (row < 0 || col < 0)
        row = col = -1;

    selCol = col;
    selRow = row;

    updateCell(oldRow, oldCol);
    updateCell(selRow, selCol);
    if (row >= 0)
        emit selected(row, col);

#if QT_CONFIG(menu)
    if (isVisible() && qobject_cast<QMenu*>(parentWidget()))
        parentWidget()->close();
#endif
}